

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::updateBindlessQualifier(TParseContext *this,TType *memberType)

{
  TTypeList *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  mapped_type *pmVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  ulong uVar8;
  
  iVar3 = (*memberType->_vptr_TType[0x37])(memberType);
  if ((char)iVar3 != '\0') {
    iVar3 = (*memberType->_vptr_TType[0x25])(memberType);
    if ((char)iVar3 == '\0') {
      iVar3 = (*memberType->_vptr_TType[9])(memberType);
      if ((((*(uint *)CONCAT44(extraout_var,iVar3) >> 0x13 & 1) == 0) ||
          (uVar4 = *(uint *)CONCAT44(extraout_var,iVar3) & 0xff00, uVar4 == 0x700)) ||
         (uVar4 == 0x800)) {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                 ::operator[](&((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                               bindlessTextureModeCaller,&this->currentCaller);
        *pmVar6 = AstRefTypeLayout;
        iVar3 = (*memberType->_vptr_TType[10])(memberType);
        *(undefined1 *)(CONCAT44(extraout_var_00,iVar3) + 0x48) = 1;
      }
      else {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
                 ::operator[](&((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                               bindlessImageModeCaller,&this->currentCaller);
        *pmVar6 = AstRefTypeLayout;
        iVar3 = (*memberType->_vptr_TType[10])(memberType);
        *(undefined1 *)(CONCAT44(extraout_var_01,iVar3) + 0x49) = 1;
      }
    }
    else {
      iVar3 = (*memberType->_vptr_TType[0x25])();
      if ((char)iVar3 == '\0') {
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
      }
      pTVar1 = (memberType->field_13).structure;
      pTVar5 = (pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
               ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl
          .super__Vector_impl_data._M_finish != pTVar5) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          updateBindlessQualifier(this,pTVar5[uVar7].type);
          pTVar5 = (pTVar1->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar8 < (ulong)((long)(pTVar1->
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ).
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >>
                                 5);
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar2);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::updateBindlessQualifier(TType& memberType)
{
    if (memberType.containsSampler()) {
        if (memberType.isStruct()) {
            TTypeList* typeList = memberType.getWritableStruct();
            for (unsigned int member = 0; member < typeList->size(); ++member) {
                TType* subMemberType = (*typeList)[member].type;
                updateBindlessQualifier(*subMemberType);
            }
        }
        else if (memberType.getSampler().isImage()) {
            intermediate.setBindlessImageMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessImage = true;
        }
        else {
            intermediate.setBindlessTextureMode(currentCaller, AstRefTypeLayout);
            memberType.getQualifier().layoutBindlessSampler = true;
        }
    }
}